

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitFactor.c
# Opt level: O2

Kit_Edge_t Kit_SopFactor_rec(Kit_Graph_t *pFForm,Kit_Sop_t *cSop,int nLits,Vec_Int_t *vMemory)

{
  uint __line;
  int iVar1;
  Kit_Edge_t KVar2;
  Kit_Edge_t KVar3;
  Kit_Sop_t *cResult;
  char *__assertion;
  Kit_Sop_t Div;
  Kit_Sop_t Rem;
  Kit_Sop_t Quo;
  Kit_Sop_t Com;
  
  if (cSop->nCubes < 1) {
    __assertion = "Kit_SopCubeNum(cSop) > 0";
    __line = 0x73;
LAB_004c9089:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitFactor.c"
                  ,__line,
                  "Kit_Edge_t Kit_SopFactor_rec(Kit_Graph_t *, Kit_Sop_t *, int, Vec_Int_t *)");
  }
  iVar1 = Kit_SopDivisor(&Div,cSop,nLits,vMemory);
  if (iVar1 == 0) {
    KVar3 = Kit_SopFactorTrivial_rec(pFForm,cSop->pCubes,cSop->nCubes,nLits);
  }
  else {
    Kit_SopDivideInternal(cSop,&Div,&Quo,&Rem,vMemory);
    if (Quo.nCubes < 1) {
      __assertion = "Kit_SopCubeNum(cQuo) > 0";
      __line = 0x7d;
      goto LAB_004c9089;
    }
    if (Quo.nCubes == 1) {
      cResult = &Quo;
    }
    else {
      Kit_SopMakeCubeFree(&Quo);
      Kit_SopDivideInternal(cSop,&Quo,&Div,&Rem,vMemory);
      iVar1 = Kit_SopIsCubeFree(&Div);
      if (iVar1 != 0) {
        KVar3 = Kit_SopFactor_rec(pFForm,&Div,nLits,vMemory);
        KVar2 = Kit_SopFactor_rec(pFForm,&Quo,nLits,vMemory);
        KVar3 = Kit_GraphAddNodeAnd(pFForm,KVar3,KVar2);
        if (Rem.nCubes == 0) {
          return KVar3;
        }
        KVar2 = Kit_SopFactor_rec(pFForm,&Rem,nLits,vMemory);
        KVar3 = Kit_GraphAddNodeOr(pFForm,KVar3,KVar2);
        return KVar3;
      }
      cResult = &Com;
      Kit_SopCommonCubeCover(cResult,&Div,vMemory);
    }
    KVar3 = Kit_SopFactorLF_rec(pFForm,cSop,cResult,nLits,vMemory);
  }
  return KVar3;
}

Assistant:

Kit_Edge_t Kit_SopFactor_rec( Kit_Graph_t * pFForm, Kit_Sop_t * cSop, int nLits, Vec_Int_t * vMemory )
{
    Kit_Sop_t Div, Quo, Rem, Com;
    Kit_Sop_t * cDiv = &Div, * cQuo = &Quo, * cRem = &Rem, * cCom = &Com;
    Kit_Edge_t eNodeDiv, eNodeQuo, eNodeRem, eNodeAnd;

    // make sure the cover contains some cubes
    assert( Kit_SopCubeNum(cSop) > 0 );

    // get the divisor
    if ( !Kit_SopDivisor(cDiv, cSop, nLits, vMemory) )
        return Kit_SopFactorTrivial( pFForm, cSop, nLits );

    // divide the cover by the divisor
    Kit_SopDivideInternal( cSop, cDiv, cQuo, cRem, vMemory );

    // check the trivial case
    assert( Kit_SopCubeNum(cQuo) > 0 );
    if ( Kit_SopCubeNum(cQuo) == 1 )
        return Kit_SopFactorLF_rec( pFForm, cSop, cQuo, nLits, vMemory );

    // make the quotient cube ABC_FREE
    Kit_SopMakeCubeFree( cQuo );

    // divide the cover by the quotient
    Kit_SopDivideInternal( cSop, cQuo, cDiv, cRem, vMemory );

    // check the trivial case
    if ( Kit_SopIsCubeFree( cDiv ) )
    {
        eNodeDiv = Kit_SopFactor_rec( pFForm, cDiv, nLits, vMemory );
        eNodeQuo = Kit_SopFactor_rec( pFForm, cQuo, nLits, vMemory );
        eNodeAnd = Kit_GraphAddNodeAnd( pFForm, eNodeDiv, eNodeQuo );
        if ( Kit_SopCubeNum(cRem) == 0 )
            return eNodeAnd;
        eNodeRem = Kit_SopFactor_rec( pFForm, cRem, nLits, vMemory );
        return Kit_GraphAddNodeOr( pFForm, eNodeAnd, eNodeRem );
    }

    // get the common cube
    Kit_SopCommonCubeCover( cCom, cDiv, vMemory );

    // solve the simple problem
    return Kit_SopFactorLF_rec( pFForm, cSop, cCom, nLits, vMemory );
}